

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3HasExplicitNulls(Parse *pParse,ExprList *pList)

{
  u8 uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  
  if (pList == (ExprList *)0x0) {
    return 0;
  }
  uVar3 = (ulong)(uint)pList->nExpr;
  if (pList->nExpr < 1) {
    uVar3 = 0;
  }
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (uVar3 * 0x18 + 0x18 == lVar4 + 0x18) {
      return 0;
    }
    lVar2 = lVar4 + 0x18;
  } while (((&pList->a[0].fg.field_0x1)[lVar4] & 0x20) == 0);
  uVar1 = (&pList->a[0].fg.sortFlags)[lVar4];
  pcVar5 = "LAST";
  if (uVar1 == '\x03') {
    pcVar5 = "FIRST";
  }
  if (uVar1 == '\0') {
    pcVar5 = "FIRST";
  }
  sqlite3ErrorMsg(pParse,"unsupported use of NULLS %s",pcVar5);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3HasExplicitNulls(Parse *pParse, ExprList *pList){
  if( pList ){
    int i;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].fg.bNulls ){
        u8 sf = pList->a[i].fg.sortFlags;
        sqlite3ErrorMsg(pParse, "unsupported use of NULLS %s",
            (sf==0 || sf==3) ? "FIRST" : "LAST"
        );
        return 1;
      }
    }
  }
  return 0;
}